

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

void __thiscall anon_unknown.dwarf_5e0633::Helper::Helper(Helper *this,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  string *psVar2;
  ulong uVar3;
  allocator<char> local_39;
  string local_38;
  cmExecutionStatus *local_18;
  cmExecutionStatus *status_local;
  Helper *this_local;
  
  this->Status = status;
  local_18 = status;
  status_local = (cmExecutionStatus *)this;
  pcVar1 = cmExecutionStatus::GetMakefile(status);
  this->Makefile = pcVar1;
  std::__cxx11::string::string((string *)&this->DefaultComponentName);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_INSTALL_DEFAULT_COMPONENT_NAME",&local_39);
  psVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_38);
  std::__cxx11::string::operator=((string *)&this->DefaultComponentName,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    std::__cxx11::string::operator=((string *)&this->DefaultComponentName,"Unspecified");
  }
  return;
}

Assistant:

Helper(cmExecutionStatus& status)
    : Status(status)
    , Makefile(&status.GetMakefile())
  {
    this->DefaultComponentName = this->Makefile->GetSafeDefinition(
      "CMAKE_INSTALL_DEFAULT_COMPONENT_NAME");
    if (this->DefaultComponentName.empty()) {
      this->DefaultComponentName = "Unspecified";
    }
  }